

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  byte bVar1;
  U32 UVar2;
  uint uVar3;
  int iVar4;
  BYTE *pBVar5;
  U32 *pUVar6;
  ZSTD_matchState_t *pZVar7;
  U32 *pUVar8;
  BYTE *pBVar9;
  BYTE *pBVar10;
  bool bVar11;
  char cVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  U32 *chainTable_2;
  U32 *chainTable;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong *puVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  U32 UVar23;
  int iVar24;
  uint uVar25;
  ulong *puVar26;
  ulong local_a0;
  
  uVar14 = (ms->cParams).minMatch;
  if (uVar14 - 6 < 2) {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar14 = 1 << (bVar1 & 0x1f);
    pBVar5 = (ms->window).base;
    uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar20 = (uint)((long)ip - (long)pBVar5);
    UVar23 = uVar20 - uVar16;
    if (uVar20 - UVar2 <= uVar16) {
      UVar23 = UVar2;
    }
    if (ms->loadedDictEnd != 0) {
      UVar23 = UVar2;
    }
    uVar16 = uVar20 - uVar14;
    if (uVar20 < uVar14) {
      uVar16 = 0;
    }
    iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    pUVar6 = ms->chainTable;
    uVar3 = (ms->window).dictLimit;
    pZVar7 = ms->dictMatchState;
    pUVar8 = ms->hashTable;
    uVar15 = (ulong)ms->nextToUpdate;
    cVar12 = (char)(ms->cParams).hashLog;
    if (ms->nextToUpdate < uVar20) {
      do {
        uVar22 = (ulong)(*(long *)(pBVar5 + uVar15) * -0x30e4432340650000) >>
                 (0x40U - cVar12 & 0x3f);
        pUVar6[(uint)uVar15 & ~(-1 << (bVar1 & 0x1f))] = pUVar8[uVar22];
        pUVar8[uVar22] = (uint)uVar15;
        uVar15 = uVar15 + 1;
      } while (uVar15 < ((long)ip - (long)pBVar5 & 0xffffffffU));
    }
    ms->nextToUpdate = uVar20;
    uVar17 = pUVar8[(ulong)(*(long *)ip * -0x30e4432340650000) >> (-cVar12 & 0x3fU)];
    local_a0 = 3;
    if (UVar23 <= uVar17) {
      local_a0 = 3;
      do {
        puVar19 = (ulong *)(pBVar5 + uVar17);
        if (*(BYTE *)(local_a0 + (long)puVar19) == ip[local_a0]) {
          puVar26 = (ulong *)ip;
          if (ip < iLimit + -7) {
            uVar22 = *(ulong *)ip ^ *puVar19;
            uVar15 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = uVar15 >> 3 & 0x1fffffff;
            puVar26 = (ulong *)(ip + 8);
            if (*puVar19 == *(ulong *)ip) {
              do {
                puVar19 = puVar19 + 1;
                if (iLimit + -7 <= puVar26) goto LAB_0020a59d;
                uVar22 = *puVar26;
                uVar21 = uVar22 ^ *puVar19;
                uVar15 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar15 = (long)puVar26 + ((uVar15 >> 3 & 0x1fffffff) - (long)ip);
                puVar26 = puVar26 + 1;
              } while (*puVar19 == uVar22);
            }
          }
          else {
LAB_0020a59d:
            if ((puVar26 < iLimit + -3) && ((int)*puVar19 == (int)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 4);
              puVar19 = (ulong *)((long)puVar19 + 4);
            }
            if ((puVar26 < iLimit + -1) && ((short)*puVar19 == (short)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 2);
              puVar19 = (ulong *)((long)puVar19 + 2);
            }
            if (puVar26 < iLimit) {
              puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar19 == (char)*puVar26));
            }
            uVar15 = (long)puVar26 - (long)ip;
          }
        }
        else {
          uVar15 = 0;
        }
        if ((local_a0 < uVar15) &&
           (*offsetPtr = (ulong)((uVar20 + 2) - uVar17), local_a0 = uVar15, ip + uVar15 == iLimit))
        {
          bVar11 = false;
        }
        else if (uVar16 < uVar17) {
          uVar17 = pUVar6[uVar17 & uVar14 - 1];
          bVar11 = true;
        }
        else {
          bVar11 = false;
        }
      } while (((bVar11) && (iVar24 = iVar24 + -1, UVar23 <= uVar17)) && (iVar24 != 0));
    }
    uVar17 = 1 << ((byte)(pZVar7->cParams).chainLog & 0x1f);
    pBVar9 = (pZVar7->window).nextSrc;
    pBVar10 = (pZVar7->window).base;
    uVar14 = (int)pBVar9 - (int)pBVar10;
    uVar16 = uVar14 - uVar17;
    if (uVar14 < uVar17) {
      uVar16 = 0;
    }
    uVar18 = (pZVar7->window).dictLimit;
    uVar25 = pZVar7->hashTable
             [(ulong)(*(long *)ip * -0x30e4432340650000) >>
              (-(char)(pZVar7->cParams).hashLog & 0x3fU)];
    if (iVar24 != 0 && uVar18 <= uVar25) {
      pUVar6 = pZVar7->chainTable;
      iVar4 = *(int *)ip;
      do {
        iVar24 = iVar24 + -1;
        if (*(int *)(pBVar10 + uVar25) == iVar4) {
          sVar13 = ZSTD_count_2segments
                             (ip + 4,pBVar10 + (ulong)uVar25 + 4,iLimit,pBVar9,pBVar5 + uVar3);
          uVar15 = sVar13 + 4;
        }
        else {
          uVar15 = 0;
        }
        if ((local_a0 < uVar15) &&
           (*offsetPtr = (ulong)((uVar14 + (uVar20 - uVar3) + 2) - uVar25), local_a0 = uVar15,
           ip + uVar15 == iLimit)) {
          bVar11 = false;
        }
        else if (uVar16 < uVar25) {
          uVar25 = pUVar6[uVar25 & uVar17 - 1];
          bVar11 = true;
        }
        else {
          bVar11 = false;
        }
      } while (((bVar11) && (uVar18 <= uVar25)) && (iVar24 != 0));
    }
  }
  else if (uVar14 == 5) {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar14 = 1 << (bVar1 & 0x1f);
    pBVar5 = (ms->window).base;
    uVar16 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar20 = (uint)((long)ip - (long)pBVar5);
    UVar23 = uVar20 - uVar16;
    if (uVar20 - UVar2 <= uVar16) {
      UVar23 = UVar2;
    }
    if (ms->loadedDictEnd != 0) {
      UVar23 = UVar2;
    }
    uVar16 = uVar20 - uVar14;
    if (uVar20 < uVar14) {
      uVar16 = 0;
    }
    iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    pUVar6 = ms->chainTable;
    uVar3 = (ms->window).dictLimit;
    pZVar7 = ms->dictMatchState;
    pUVar8 = ms->hashTable;
    uVar15 = (ulong)ms->nextToUpdate;
    cVar12 = (char)(ms->cParams).hashLog;
    if (ms->nextToUpdate < uVar20) {
      do {
        uVar22 = (ulong)(*(long *)(pBVar5 + uVar15) * -0x30e4432345000000) >>
                 (0x40U - cVar12 & 0x3f);
        pUVar6[(uint)uVar15 & ~(-1 << (bVar1 & 0x1f))] = pUVar8[uVar22];
        pUVar8[uVar22] = (uint)uVar15;
        uVar15 = uVar15 + 1;
      } while (uVar15 < ((long)ip - (long)pBVar5 & 0xffffffffU));
    }
    ms->nextToUpdate = uVar20;
    uVar17 = pUVar8[(ulong)(*(long *)ip * -0x30e4432345000000) >> (-cVar12 & 0x3fU)];
    local_a0 = 3;
    if (UVar23 <= uVar17) {
      local_a0 = 3;
      do {
        puVar19 = (ulong *)(pBVar5 + uVar17);
        if (*(BYTE *)(local_a0 + (long)puVar19) == ip[local_a0]) {
          puVar26 = (ulong *)ip;
          if (ip < iLimit + -7) {
            uVar22 = *(ulong *)ip ^ *puVar19;
            uVar15 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = uVar15 >> 3 & 0x1fffffff;
            puVar26 = (ulong *)(ip + 8);
            if (*puVar19 == *(ulong *)ip) {
              do {
                puVar19 = puVar19 + 1;
                if (iLimit + -7 <= puVar26) goto LAB_0020a963;
                uVar22 = *puVar26;
                uVar21 = uVar22 ^ *puVar19;
                uVar15 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar15 = (long)puVar26 + ((uVar15 >> 3 & 0x1fffffff) - (long)ip);
                puVar26 = puVar26 + 1;
              } while (*puVar19 == uVar22);
            }
          }
          else {
LAB_0020a963:
            if ((puVar26 < iLimit + -3) && ((int)*puVar19 == (int)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 4);
              puVar19 = (ulong *)((long)puVar19 + 4);
            }
            if ((puVar26 < iLimit + -1) && ((short)*puVar19 == (short)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 2);
              puVar19 = (ulong *)((long)puVar19 + 2);
            }
            if (puVar26 < iLimit) {
              puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar19 == (char)*puVar26));
            }
            uVar15 = (long)puVar26 - (long)ip;
          }
        }
        else {
          uVar15 = 0;
        }
        if ((local_a0 < uVar15) &&
           (*offsetPtr = (ulong)((uVar20 + 2) - uVar17), local_a0 = uVar15, ip + uVar15 == iLimit))
        {
          bVar11 = false;
        }
        else if (uVar16 < uVar17) {
          uVar17 = pUVar6[uVar17 & uVar14 - 1];
          bVar11 = true;
        }
        else {
          bVar11 = false;
        }
      } while (((bVar11) && (iVar24 = iVar24 + -1, UVar23 <= uVar17)) && (iVar24 != 0));
    }
    uVar17 = 1 << ((byte)(pZVar7->cParams).chainLog & 0x1f);
    pBVar9 = (pZVar7->window).nextSrc;
    pBVar10 = (pZVar7->window).base;
    uVar14 = (int)pBVar9 - (int)pBVar10;
    uVar16 = uVar14 - uVar17;
    if (uVar14 < uVar17) {
      uVar16 = 0;
    }
    uVar18 = (pZVar7->window).dictLimit;
    uVar25 = pZVar7->hashTable
             [(ulong)(*(long *)ip * -0x30e4432345000000) >>
              (-(char)(pZVar7->cParams).hashLog & 0x3fU)];
    if (iVar24 != 0 && uVar18 <= uVar25) {
      pUVar6 = pZVar7->chainTable;
      iVar4 = *(int *)ip;
      do {
        iVar24 = iVar24 + -1;
        if (*(int *)(pBVar10 + uVar25) == iVar4) {
          sVar13 = ZSTD_count_2segments
                             (ip + 4,pBVar10 + (ulong)uVar25 + 4,iLimit,pBVar9,pBVar5 + uVar3);
          uVar15 = sVar13 + 4;
        }
        else {
          uVar15 = 0;
        }
        if ((local_a0 < uVar15) &&
           (*offsetPtr = (ulong)((uVar14 + (uVar20 - uVar3) + 2) - uVar25), local_a0 = uVar15,
           ip + uVar15 == iLimit)) {
          bVar11 = false;
        }
        else if (uVar16 < uVar25) {
          uVar25 = pUVar6[uVar25 & uVar17 - 1];
          bVar11 = true;
        }
        else {
          bVar11 = false;
        }
      } while (((bVar11) && (uVar18 <= uVar25)) && (iVar24 != 0));
    }
  }
  else {
    bVar1 = (byte)(ms->cParams).chainLog;
    uVar16 = 1 << (bVar1 & 0x1f);
    pBVar5 = (ms->window).base;
    uVar14 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar2 = (ms->window).lowLimit;
    uVar20 = (uint)((long)ip - (long)pBVar5);
    UVar23 = uVar20 - uVar14;
    if (uVar20 - UVar2 <= uVar14) {
      UVar23 = UVar2;
    }
    if (ms->loadedDictEnd != 0) {
      UVar23 = UVar2;
    }
    uVar14 = uVar20 - uVar16;
    if (uVar20 < uVar16) {
      uVar14 = 0;
    }
    iVar24 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    pUVar6 = ms->chainTable;
    uVar3 = (ms->window).dictLimit;
    pZVar7 = ms->dictMatchState;
    pUVar8 = ms->hashTable;
    uVar15 = (ulong)ms->nextToUpdate;
    cVar12 = (char)(ms->cParams).hashLog;
    if (ms->nextToUpdate < uVar20) {
      do {
        uVar17 = (uint)(*(int *)(pBVar5 + uVar15) * -0x61c8864f) >> (0x20U - cVar12 & 0x1f);
        pUVar6[(uint)uVar15 & ~(-1 << (bVar1 & 0x1f))] = pUVar8[uVar17];
        pUVar8[uVar17] = (uint)uVar15;
        uVar15 = uVar15 + 1;
      } while (uVar15 < ((long)ip - (long)pBVar5 & 0xffffffffU));
    }
    ms->nextToUpdate = uVar20;
    iVar4 = *(int *)ip;
    uVar18 = iVar4 * -0x61c8864f;
    uVar17 = pUVar8[uVar18 >> (-cVar12 & 0x1fU)];
    local_a0 = 3;
    if (UVar23 <= uVar17) {
      local_a0 = 3;
      do {
        puVar19 = (ulong *)(pBVar5 + uVar17);
        if (*(BYTE *)(local_a0 + (long)puVar19) == ip[local_a0]) {
          puVar26 = (ulong *)ip;
          if (ip < iLimit + -7) {
            uVar22 = *(ulong *)ip ^ *puVar19;
            uVar15 = 0;
            if (uVar22 != 0) {
              for (; (uVar22 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
              }
            }
            uVar15 = uVar15 >> 3 & 0x1fffffff;
            puVar26 = (ulong *)(ip + 8);
            if (*puVar19 == *(ulong *)ip) {
              do {
                puVar19 = puVar19 + 1;
                if (iLimit + -7 <= puVar26) goto LAB_0020aad9;
                uVar22 = *puVar26;
                uVar21 = uVar22 ^ *puVar19;
                uVar15 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar15 = (long)puVar26 + ((uVar15 >> 3 & 0x1fffffff) - (long)ip);
                puVar26 = puVar26 + 1;
              } while (*puVar19 == uVar22);
            }
          }
          else {
LAB_0020aad9:
            if ((puVar26 < iLimit + -3) && ((int)*puVar19 == (int)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 4);
              puVar19 = (ulong *)((long)puVar19 + 4);
            }
            if ((puVar26 < iLimit + -1) && ((short)*puVar19 == (short)*puVar26)) {
              puVar26 = (ulong *)((long)puVar26 + 2);
              puVar19 = (ulong *)((long)puVar19 + 2);
            }
            if (puVar26 < iLimit) {
              puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar19 == (char)*puVar26));
            }
            uVar15 = (long)puVar26 - (long)ip;
          }
        }
        else {
          uVar15 = 0;
        }
        if ((local_a0 < uVar15) &&
           (*offsetPtr = (ulong)((uVar20 + 2) - uVar17), local_a0 = uVar15, ip + uVar15 == iLimit))
        {
          bVar11 = false;
        }
        else if (uVar14 < uVar17) {
          uVar17 = pUVar6[uVar17 & uVar16 - 1];
          bVar11 = true;
        }
        else {
          bVar11 = false;
        }
      } while (((bVar11) && (iVar24 = iVar24 + -1, UVar23 <= uVar17)) && (iVar24 != 0));
    }
    uVar17 = 1 << ((byte)(pZVar7->cParams).chainLog & 0x1f);
    pBVar9 = (pZVar7->window).nextSrc;
    pBVar10 = (pZVar7->window).base;
    uVar14 = (int)pBVar9 - (int)pBVar10;
    uVar16 = uVar14 - uVar17;
    if (uVar14 < uVar17) {
      uVar16 = 0;
    }
    uVar25 = (pZVar7->window).dictLimit;
    uVar18 = pZVar7->hashTable[uVar18 >> (-(char)(pZVar7->cParams).hashLog & 0x1fU)];
    if (iVar24 != 0 && uVar25 <= uVar18) {
      pUVar6 = pZVar7->chainTable;
      do {
        iVar24 = iVar24 + -1;
        if (*(int *)(pBVar10 + uVar18) == iVar4) {
          sVar13 = ZSTD_count_2segments
                             (ip + 4,pBVar10 + (ulong)uVar18 + 4,iLimit,pBVar9,pBVar5 + uVar3);
          uVar15 = sVar13 + 4;
        }
        else {
          uVar15 = 0;
        }
        if ((local_a0 < uVar15) &&
           (*offsetPtr = (ulong)((uVar14 + (uVar20 - uVar3) + 2) - uVar18), local_a0 = uVar15,
           ip + uVar15 == iLimit)) {
          bVar11 = false;
        }
        else if (uVar16 < uVar18) {
          uVar18 = pUVar6[uVar18 & uVar17 - 1];
          bVar11 = true;
        }
        else {
          bVar11 = false;
        }
      } while (((bVar11) && (uVar25 <= uVar18)) && (iVar24 != 0));
    }
  }
  return local_a0;
}

Assistant:

static size_t ZSTD_HcFindBestMatch_dictMatchState_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_dictMatchState);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_dictMatchState);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_dictMatchState);
    }
}